

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmNinjaTargetGenerator::WriteObjectBuildStatement(cmNinjaTargetGenerator *this,cmSourceFile *source)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmGeneratorTarget *pcVar3;
  pointer pSVar4;
  cmSourceFile *this_00;
  char *pcVar5;
  cmLocalNinjaGenerator *pcVar6;
  cmMakefile *this_01;
  pointer pcVar7;
  cmGeneratedFileStream *os;
  pointer pbVar8;
  pointer pbVar9;
  size_type sVar10;
  pointer pbVar11;
  pointer pbVar12;
  pointer pbVar13;
  pointer pbVar14;
  pointer pbVar15;
  bool bVar16;
  int iVar17;
  int iVar18;
  string *psVar19;
  mapped_type *pmVar20;
  KindedSources *pKVar21;
  long *plVar22;
  char *pcVar23;
  mapped_type *defines;
  mapped_type *includes;
  size_t sVar24;
  MapToNinjaPathImpl MVar25;
  cmCustomCommand *pcVar26;
  cmGlobalNinjaGenerator *pcVar27;
  iterator iVar28;
  mapped_type *this_02;
  cmGlobalNinjaGenerator *pcVar29;
  size_type *psVar30;
  undefined8 uVar31;
  _Alloc_hider _Var32;
  cmNinjaTargetGenerator *pcVar33;
  string *odi;
  pointer pSVar34;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar35;
  string ppRspFile;
  string rule;
  string comment;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_4;
  string rspfile;
  Names targetNames;
  uint local_2e8;
  string objectFileName;
  cmNinjaVars vars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_3;
  string language;
  string ppRule;
  cmNinjaDeps local_228;
  string ppFileName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  string sourceFileName;
  string objectFileDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sourceDirectory;
  cmNinjaDeps ppImplicitOuts;
  cmNinjaDeps ppOutputs;
  key_type local_a8;
  key_type local_88;
  string objectDir;
  cmNinjaDeps outputs;
  
  pcVar33 = (cmNinjaTargetGenerator *)&ppRspFile;
  cmSourceFile::GetLanguage_abi_cxx11_(&language,source);
  iVar17 = std::__cxx11::string::compare((char *)&language);
  if (iVar17 == 0) {
    psVar19 = cmSourceFile::GetFullPath_abi_cxx11_(source);
    sourceFileName._M_dataplus._M_p = (pointer)&sourceFileName.field_2;
    pcVar7 = (psVar19->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sourceFileName,pcVar7,pcVar7 + psVar19->_M_string_length);
  }
  else {
    psVar19 = cmSourceFile::GetFullPath_abi_cxx11_(source);
    ConvertToNinjaPath(&sourceFileName,this,psVar19);
  }
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            (&targetNames.Base,(this->super_cmCommonTargetGenerator).GeneratorTarget);
  ConvertToNinjaPath(&objectDir,this,&targetNames.Base);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
    operator_delete(targetNames.Base._M_dataplus._M_p,
                    targetNames.Base.field_2._M_allocated_capacity + 1);
  }
  GetObjectFilePath_abi_cxx11_(&targetNames.Base,this,source);
  ConvertToNinjaPath(&objectFileName,this,&targetNames.Base);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
    operator_delete(targetNames.Base._M_dataplus._M_p,
                    targetNames.Base.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemTools::GetFilenamePath(&objectFileDir,&objectFileName);
  iVar17 = std::__cxx11::string::compare((char *)&language);
  if ((iVar17 == 0) || (iVar17 = std::__cxx11::string::compare((char *)&language), iVar17 == 0)) {
    local_2e8 = 0;
  }
  else {
    bVar16 = ForceResponseFile(this);
    local_2e8 = (uint)bVar16;
  }
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ComputeFlagsForObject(&targetNames.Base,this,source,&language);
  comment._M_dataplus._M_p = (pointer)&comment.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&comment,"FLAGS","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&comment);
  std::__cxx11::string::operator=((string *)pmVar20,(string *)&targetNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment._M_dataplus._M_p != &comment.field_2) {
    operator_delete(comment._M_dataplus._M_p,
                    CONCAT71(comment.field_2._M_allocated_capacity._1_7_,
                             comment.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
    operator_delete(targetNames.Base._M_dataplus._M_p,
                    targetNames.Base.field_2._M_allocated_capacity + 1);
  }
  ComputeDefines(&targetNames.Base,this,source,&language);
  comment._M_dataplus._M_p = (pointer)&comment.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&comment,"DEFINES","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&comment);
  std::__cxx11::string::operator=((string *)pmVar20,(string *)&targetNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment._M_dataplus._M_p != &comment.field_2) {
    operator_delete(comment._M_dataplus._M_p,
                    CONCAT71(comment.field_2._M_allocated_capacity._1_7_,
                             comment.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
    operator_delete(targetNames.Base._M_dataplus._M_p,
                    targetNames.Base.field_2._M_allocated_capacity + 1);
  }
  ComputeIncludes(&targetNames.Base,this,source,&language);
  comment._M_dataplus._M_p = (pointer)&comment.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&comment,"INCLUDES","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&comment);
  std::__cxx11::string::operator=((string *)pmVar20,(string *)&targetNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment._M_dataplus._M_p != &comment.field_2) {
    operator_delete(comment._M_dataplus._M_p,
                    CONCAT71(comment.field_2._M_allocated_capacity._1_7_,
                             comment.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
    operator_delete(targetNames.Base._M_dataplus._M_p,
                    targetNames.Base.field_2._M_allocated_capacity + 1);
  }
  iVar17 = std::__cxx11::string::compare((char *)&language);
  if (iVar17 == 0) {
    comment._M_dataplus._M_p = (pointer)&comment.field_2;
    comment._M_string_length = 0;
    comment.field_2._M_local_buf[0] = '\0';
    pcVar3 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    psVar19 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_
                        (&this->super_cmCommonTargetGenerator);
    pKVar21 = cmGeneratorTarget::GetKindedSources(pcVar3,psVar19);
    pSVar34 = (pKVar21->Sources).
              super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar4 = (pKVar21->Sources).
             super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar34 != pSVar4) {
      do {
        this_00 = (pSVar34->Source).Value;
        if (this_00 != source) {
          psVar19 = cmSourceFile::GetFullPath_abi_cxx11_(this_00);
          ConvertToNinjaPath(&rule,this,psVar19);
          plVar22 = (long *)std::__cxx11::string::replace((ulong)&rule,0,(char *)0x0,0x55426b);
          targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
          psVar30 = (size_type *)(plVar22 + 2);
          if ((size_type *)*plVar22 == psVar30) {
            targetNames.Base.field_2._M_allocated_capacity = *psVar30;
            targetNames.Base.field_2._8_8_ = plVar22[3];
          }
          else {
            targetNames.Base.field_2._M_allocated_capacity = *psVar30;
            targetNames.Base._M_dataplus._M_p = (pointer)*plVar22;
          }
          targetNames.Base._M_string_length = plVar22[1];
          *plVar22 = (long)psVar30;
          plVar22[1] = 0;
          *(undefined1 *)(plVar22 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&comment,(ulong)targetNames.Base._M_dataplus._M_p)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
            operator_delete(targetNames.Base._M_dataplus._M_p,
                            targetNames.Base.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)rule._M_dataplus._M_p != &rule.field_2) {
            operator_delete(rule._M_dataplus._M_p,rule.field_2._M_allocated_capacity + 1);
          }
        }
        pSVar34 = pSVar34 + 1;
      } while (pSVar34 != pSVar4);
    }
    targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&targetNames,"SWIFT_AUXILIARY_SOURCES","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&targetNames.Base);
    std::__cxx11::string::_M_assign((string *)pmVar20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
      operator_delete(targetNames.Base._M_dataplus._M_p,
                      targetNames.Base.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&targetNames,"SWIFT_MODULE_NAME","");
    pcVar23 = cmGeneratorTarget::GetProperty(pcVar3,&targetNames.Base);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
      operator_delete(targetNames.Base._M_dataplus._M_p,
                      targetNames.Base.field_2._M_allocated_capacity + 1);
    }
    if (pcVar23 == (char *)0x0) {
      cmGeneratorTarget::GetName_abi_cxx11_((this->super_cmCommonTargetGenerator).GeneratorTarget);
      targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&targetNames,"SWIFT_MODULE_NAME","")
      ;
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&targetNames.Base);
      std::__cxx11::string::_M_assign((string *)pmVar20);
    }
    else {
      targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&targetNames,"SWIFT_MODULE_NAME","")
      ;
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&targetNames.Base);
      pcVar5 = (char *)pmVar20->_M_string_length;
      strlen(pcVar23);
      std::__cxx11::string::_M_replace((ulong)pmVar20,0,pcVar5,(ulong)pcVar23);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
      operator_delete(targetNames.Base._M_dataplus._M_p,
                      targetNames.Base.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    psVar19 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_
                        (&this->super_cmCommonTargetGenerator);
    cmGeneratorTarget::GetLibraryNames(&targetNames,pcVar3,psVar19);
    paVar1 = &rule.field_2;
    rule._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rule,"SWIFT_LIBRARY_NAME","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rule);
    std::__cxx11::string::_M_assign((string *)pmVar20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rule._M_dataplus._M_p != paVar1) {
      operator_delete(rule._M_dataplus._M_p,rule.field_2._M_allocated_capacity + 1);
    }
    rule._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rule,"SWIFT_PARTIAL_MODULE","");
    pcVar23 = cmSourceFile::GetProperty(source,&rule);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rule._M_dataplus._M_p != paVar1) {
      operator_delete(rule._M_dataplus._M_p,rule.field_2._M_allocated_capacity + 1);
    }
    if (pcVar23 == (char *)0x0) {
      rule._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&rule,objectFileName._M_dataplus._M_p,
                 objectFileName._M_dataplus._M_p + objectFileName._M_string_length);
      std::__cxx11::string::append((char *)&rule);
      rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"SWIFT_PARTIAL_MODULE","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&rspfile);
      std::__cxx11::string::operator=((string *)pmVar20,(string *)&rule);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
        operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      rule._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&rule,"SWIFT_PARTIAL_MODULE","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&rule);
      pcVar5 = (char *)pmVar20->_M_string_length;
      strlen(pcVar23);
      std::__cxx11::string::_M_replace((ulong)pmVar20,0,pcVar5,(ulong)pcVar23);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rule._M_dataplus._M_p != paVar1) {
      operator_delete(rule._M_dataplus._M_p,rule.field_2._M_allocated_capacity + 1);
    }
    rule._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rule,"SWIFT_PARTIAL_DOC","");
    pcVar23 = cmSourceFile::GetProperty(source,&rule);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rule._M_dataplus._M_p != paVar1) {
      operator_delete(rule._M_dataplus._M_p,rule.field_2._M_allocated_capacity + 1);
    }
    if (pcVar23 == (char *)0x0) {
      rule._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&rule,objectFileName._M_dataplus._M_p,
                 objectFileName._M_dataplus._M_p + objectFileName._M_string_length);
      std::__cxx11::string::append((char *)&rule);
      rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"SWIFT_PARTIAL_DOC","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&rspfile);
      std::__cxx11::string::operator=((string *)pmVar20,(string *)&rule);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
        operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      rule._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&rule,"SWIFT_PARTIAL_DOC","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&rule);
      pcVar5 = (char *)pmVar20->_M_string_length;
      strlen(pcVar23);
      std::__cxx11::string::_M_replace((ulong)pmVar20,0,pcVar5,(ulong)pcVar23);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rule._M_dataplus._M_p != paVar1) {
      operator_delete(rule._M_dataplus._M_p,rule.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.SharedObject._M_dataplus._M_p != &targetNames.SharedObject.field_2) {
      operator_delete(targetNames.SharedObject._M_dataplus._M_p,
                      targetNames.SharedObject.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.PDB._M_dataplus._M_p != &targetNames.PDB.field_2) {
      operator_delete(targetNames.PDB._M_dataplus._M_p,
                      targetNames.PDB.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.ImportLibrary._M_dataplus._M_p != &targetNames.ImportLibrary.field_2) {
      operator_delete(targetNames.ImportLibrary._M_dataplus._M_p,
                      targetNames.ImportLibrary.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.Real._M_dataplus._M_p != &targetNames.Real.field_2) {
      operator_delete(targetNames.Real._M_dataplus._M_p,
                      targetNames.Real.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.Output._M_dataplus._M_p != &targetNames.Output.field_2) {
      operator_delete(targetNames.Output._M_dataplus._M_p,
                      targetNames.Output.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
      operator_delete(targetNames.Base._M_dataplus._M_p,
                      targetNames.Base.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)comment._M_dataplus._M_p != &comment.field_2) {
      operator_delete(comment._M_dataplus._M_p,
                      CONCAT71(comment.field_2._M_allocated_capacity._1_7_,
                               comment.field_2._M_local_buf[0]) + 1);
    }
  }
  bVar16 = NeedDepTypeMSVC(this,&language);
  if (bVar16) goto LAB_0031b44f;
  if (language._M_string_length == 0) {
LAB_0031b016:
    pcVar6 = this->LocalGenerator;
    comment._M_dataplus._M_p = (pointer)&comment.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&comment,objectFileName._M_dataplus._M_p,
               objectFileName._M_dataplus._M_p + objectFileName._M_string_length);
    std::__cxx11::string::append((char *)&comment);
    cmOutputConverter::ConvertToOutputFormat
              (&targetNames.Base,
               &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&comment,SHELL);
    rule._M_dataplus._M_p = (pointer)&rule.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rule,"DEP_FILE","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rule);
    std::__cxx11::string::operator=((string *)pmVar20,(string *)&targetNames);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rule._M_dataplus._M_p != &rule.field_2) {
      operator_delete(rule._M_dataplus._M_p,rule.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
      operator_delete(targetNames.Base._M_dataplus._M_p,
                      targetNames.Base.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)comment._M_dataplus._M_p == &comment.field_2) goto LAB_0031b44f;
    uVar31 = CONCAT71(comment.field_2._M_allocated_capacity._1_7_,comment.field_2._M_local_buf[0]);
    _Var32._M_p = comment._M_dataplus._M_p;
  }
  else {
    targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&targetNames,"CMAKE_","");
    std::__cxx11::string::_M_append((char *)&targetNames,(ulong)language._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&targetNames);
    bVar16 = cmMakefile::IsOn((this->super_cmCommonTargetGenerator).Makefile,&targetNames.Base);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
      operator_delete(targetNames.Base._M_dataplus._M_p,
                      targetNames.Base.field_2._M_allocated_capacity + 1);
    }
    if (!bVar16) goto LAB_0031b016;
    cmsys::SystemTools::GetFilenameWithoutLastExtension(&comment,&objectFileName);
    plVar22 = (long *)std::__cxx11::string::append((char *)&comment);
    targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
    psVar30 = (size_type *)(plVar22 + 2);
    if ((size_type *)*plVar22 == psVar30) {
      targetNames.Base.field_2._M_allocated_capacity = *psVar30;
      targetNames.Base.field_2._8_8_ = plVar22[3];
    }
    else {
      targetNames.Base.field_2._M_allocated_capacity = *psVar30;
      targetNames.Base._M_dataplus._M_p = (pointer)*plVar22;
    }
    targetNames.Base._M_string_length = plVar22[1];
    *plVar22 = (long)psVar30;
    plVar22[1] = 0;
    *(undefined1 *)(plVar22 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)comment._M_dataplus._M_p != &comment.field_2) {
      operator_delete(comment._M_dataplus._M_p,
                      CONCAT71(comment.field_2._M_allocated_capacity._1_7_,
                               comment.field_2._M_local_buf[0]) + 1);
    }
    pcVar6 = this->LocalGenerator;
    rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&rspfile,objectFileDir._M_dataplus._M_p,
               objectFileDir._M_dataplus._M_p + objectFileDir._M_string_length);
    std::__cxx11::string::append((char *)&rspfile);
    plVar22 = (long *)std::__cxx11::string::_M_append
                                ((char *)&rspfile,(ulong)targetNames.Base._M_dataplus._M_p);
    psVar30 = (size_type *)(plVar22 + 2);
    if ((size_type *)*plVar22 == psVar30) {
      rule.field_2._M_allocated_capacity = *psVar30;
      rule.field_2._8_8_ = plVar22[3];
      rule._M_dataplus._M_p = (pointer)&rule.field_2;
    }
    else {
      rule.field_2._M_allocated_capacity = *psVar30;
      rule._M_dataplus._M_p = (pointer)*plVar22;
    }
    rule._M_string_length = plVar22[1];
    *plVar22 = (long)psVar30;
    plVar22[1] = 0;
    *(undefined1 *)(plVar22 + 2) = 0;
    cmOutputConverter::ConvertToOutputFormat
              (&comment,&(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                         super_cmOutputConverter,&rule,SHELL);
    ppRule._M_dataplus._M_p = (pointer)&ppRule.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ppRule,"DEP_FILE","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&ppRule);
    std::__cxx11::string::operator=((string *)pmVar20,(string *)&comment);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppRule._M_dataplus._M_p != &ppRule.field_2) {
      operator_delete(ppRule._M_dataplus._M_p,ppRule.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)comment._M_dataplus._M_p != &comment.field_2) {
      operator_delete(comment._M_dataplus._M_p,
                      CONCAT71(comment.field_2._M_allocated_capacity._1_7_,
                               comment.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rule._M_dataplus._M_p != &rule.field_2) {
      operator_delete(rule._M_dataplus._M_p,rule.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
      operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
    }
    uVar31 = targetNames.Base.field_2._M_allocated_capacity;
    _Var32._M_p = targetNames.Base._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.Base._M_dataplus._M_p == &targetNames.Base.field_2) goto LAB_0031b44f;
  }
  operator_delete(_Var32._M_p,uVar31 + 1);
LAB_0031b44f:
  targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&targetNames,"FLAGS","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&targetNames.Base);
  comment._M_dataplus._M_p = (pointer)&comment.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&comment,"DEFINES","");
  defines = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&comment);
  rule._M_dataplus._M_p = (pointer)&rule.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&rule,"INCLUDES","");
  includes = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&rule);
  ExportObjectCompileCommand
            (this,&language,&sourceFileName,&objectDir,&objectFileName,&objectFileDir,pmVar20,
             defines,includes);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rule._M_dataplus._M_p != &rule.field_2) {
    operator_delete(rule._M_dataplus._M_p,rule.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment._M_dataplus._M_p != &comment.field_2) {
    operator_delete(comment._M_dataplus._M_p,
                    CONCAT71(comment.field_2._M_allocated_capacity._1_7_,
                             comment.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
    operator_delete(targetNames.Base._M_dataplus._M_p,
                    targetNames.Base.field_2._M_allocated_capacity + 1);
  }
  comment._M_dataplus._M_p = (pointer)&comment.field_2;
  comment._M_string_length = 0;
  comment.field_2._M_local_buf[0] = '\0';
  LanguageCompilerRule(&rule,this,&language);
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&outputs,&objectFileName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->Objects,&objectFileName);
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_168,&sourceFileName);
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&targetNames,"OBJECT_DEPENDS","");
  pcVar23 = cmSourceFile::GetProperty(source,&targetNames.Base);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
    operator_delete(targetNames.Base._M_dataplus._M_p,
                    targetNames.Base.field_2._M_allocated_capacity + 1);
  }
  if (pcVar23 != (char *)0x0) {
    rspfile._M_dataplus._M_p = (pointer)0x0;
    rspfile._M_string_length = 0;
    rspfile.field_2._M_allocated_capacity = 0;
    targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
    sVar24 = strlen(pcVar23);
    std::__cxx11::string::_M_construct<char_const*>((string *)&targetNames,pcVar23,pcVar23 + sVar24)
    ;
    cmSystemTools::ExpandListArgument
              (&targetNames.Base,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&rspfile,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
      operator_delete(targetNames.Base._M_dataplus._M_p,
                      targetNames.Base.field_2._M_allocated_capacity + 1);
    }
    sVar10 = rspfile._M_string_length;
    if (rspfile._M_dataplus._M_p != (pointer)rspfile._M_string_length) {
      _Var32._M_p = rspfile._M_dataplus._M_p;
      do {
        bVar16 = cmsys::SystemTools::FileIsFullPath((string *)_Var32._M_p);
        if (bVar16) {
          cmsys::SystemTools::CollapseFullPath(&targetNames.Base,(string *)_Var32._M_p);
          std::__cxx11::string::operator=((string *)_Var32._M_p,(string *)&targetNames);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
            operator_delete(targetNames.Base._M_dataplus._M_p,
                            targetNames.Base.field_2._M_allocated_capacity + 1);
          }
        }
        _Var32._M_p = _Var32._M_p + 0x20;
      } while (_Var32._M_p != (pointer)sVar10);
    }
    sVar10 = rspfile._M_string_length;
    _Var32._M_p = rspfile._M_dataplus._M_p;
    MVar25.GG = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    std::
    transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )_Var32._M_p,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )sVar10,&local_1e8,MVar25);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&rspfile);
  }
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_228.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  OrderDependsTargetForTarget_abi_cxx11_(&targetNames.Base,this);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_228,
             &targetNames.Base);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
    operator_delete(targetNames.Base._M_dataplus._M_p,
                    targetNames.Base.field_2._M_allocated_capacity + 1);
  }
  if (source->IsGenerated == true) {
    targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&targetNames,"__CMAKE_GENERATED_BY_CMAKE","");
    bVar16 = cmSourceFile::GetPropertyAsBool(source,&targetNames.Base);
    if ((bVar16) ||
       (pcVar26 = cmSourceFile::GetCustomCommand(source), pcVar26 != (cmCustomCommand *)0x0)) {
      bVar16 = false;
    }
    else {
      pcVar27 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      iVar28 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&(pcVar27->CustomCommandOutputs)._M_t,&sourceFileName);
      bVar16 = (_Rb_tree_header *)iVar28._M_node ==
               &(pcVar27->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
      operator_delete(targetNames.Base._M_dataplus._M_p,
                      targetNames.Base.field_2._M_allocated_capacity + 1);
    }
    if (bVar16) {
      pcVar27 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      cmGlobalNinjaGenerator::AddAssumedSourceDependencies(pcVar27,&sourceFileName,&local_228);
    }
  }
  iVar17 = std::__cxx11::string::compare((char *)&language);
  iVar18 = std::__cxx11::string::compare((char *)&language);
  if (iVar18 == 0) {
    iVar18 = std::__cxx11::string::compare((char *)&language);
    rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
    rspfile._M_string_length = 0;
    rspfile.field_2._M_allocated_capacity =
         rspfile.field_2._M_allocated_capacity & 0xffffffffffffff00;
    LanguagePreprocessRule(&ppRule,this,&language);
    ppOutputs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ppOutputs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ppOutputs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppImplicitOuts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppImplicitOuts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ppImplicitOuts.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_188.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_188.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    targetNames.Base.field_2._8_8_ = &targetNames.Base._M_string_length;
    targetNames.Base._M_string_length = targetNames.Base._M_string_length & 0xffffffff00000000;
    targetNames.Base.field_2._M_allocated_capacity = 0;
    targetNames.Output._M_string_length = 0;
    targetNames.Output._M_dataplus._M_p = (pointer)targetNames.Base.field_2._8_8_;
    GetPreprocessedFilePath_abi_cxx11_(&ppRspFile,this,source);
    ConvertToNinjaPath(&ppFileName,this,&ppRspFile);
    paVar1 = &ppRspFile.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppRspFile._M_dataplus._M_p != paVar1) {
      operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&ppOutputs,&ppFileName);
    pbVar15 = local_188.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar14 = local_188.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pbVar13 = local_188.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar12 = local_1a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar9 = local_1a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar8 = local_1a8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar11 = local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ppRspFile._M_dataplus._M_p = (pointer)paVar1;
    if (iVar18 == 0) {
      local_188.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_168.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_188.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_168.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_188.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_168.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_168.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pbVar13;
      local_168.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar14;
      local_168.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar15;
      local_1a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_1e8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_1e8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_1a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_1e8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_1e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pbVar8;
      local_1e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar9;
      local_1e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar12;
      local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_228.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pbVar8 = local_228.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar9 = local_228.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_228.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_1c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_228.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_1c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_228.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar11;
      local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pbVar8;
      local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&ppRspFile,"IN_ABS","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&targetNames,&ppRspFile);
      __str_4._M_dataplus._M_p = (pointer)&__str_4.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_4,"IN_ABS","");
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&vars,&__str_4);
      std::__cxx11::string::swap((string *)pmVar20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_4._M_dataplus._M_p != &__str_4.field_2) {
        operator_delete(__str_4._M_dataplus._M_p,__str_4.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppRspFile._M_dataplus._M_p != paVar1) {
        operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_168,&ppFileName);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_188,&local_168);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_1a8,&local_1e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&local_1c8,&local_228);
      std::__cxx11::string::_M_construct<char_const*>((string *)&ppRspFile,"IN_ABS","");
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&vars,&ppRspFile);
      __str_4._M_dataplus._M_p = (pointer)&__str_4.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_4,"IN_ABS","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&targetNames,&__str_4);
      std::__cxx11::string::_M_assign((string *)pmVar20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_4._M_dataplus._M_p != &__str_4.field_2) {
        operator_delete(__str_4._M_dataplus._M_p,__str_4.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppRspFile._M_dataplus._M_p != paVar1) {
        operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
      }
    }
    ppRspFile._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ppRspFile,"FLAGS","");
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](&vars,&ppRspFile);
    paVar2 = &__str_4.field_2;
    __str_4._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str_4,"FLAGS","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&targetNames,&__str_4);
    std::__cxx11::string::_M_assign((string *)pmVar20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_4._M_dataplus._M_p != paVar2) {
      operator_delete(__str_4._M_dataplus._M_p,__str_4.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppRspFile._M_dataplus._M_p != paVar1) {
      operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
    }
    if (iVar18 == 0) {
      this_01 = (this->super_cmCommonTargetGenerator).Makefile;
      std::operator+(&__str_3,"CMAKE_",&language);
      plVar22 = (long *)std::__cxx11::string::append((char *)&__str_3);
      psVar30 = (size_type *)(plVar22 + 2);
      if ((size_type *)*plVar22 == psVar30) {
        __str_4.field_2._M_allocated_capacity = *psVar30;
        __str_4.field_2._8_8_ = plVar22[3];
        __str_4._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        __str_4.field_2._M_allocated_capacity = *psVar30;
        __str_4._M_dataplus._M_p = (pointer)*plVar22;
      }
      __str_4._M_string_length = plVar22[1];
      *plVar22 = (long)psVar30;
      plVar22[1] = 0;
      *(undefined1 *)(plVar22 + 2) = 0;
      psVar19 = cmMakefile::GetSafeDefinition(this_01,&__str_4);
      pcVar7 = (psVar19->_M_dataplus)._M_p;
      ppRspFile._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&ppRspFile,pcVar7,pcVar7 + psVar19->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_4._M_dataplus._M_p != paVar2) {
        operator_delete(__str_4._M_dataplus._M_p,__str_4.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_3._M_dataplus._M_p != &__str_3.field_2) {
        operator_delete(__str_3._M_dataplus._M_p,__str_3.field_2._M_allocated_capacity + 1);
      }
      pcVar6 = this->LocalGenerator;
      __str_4._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_4,"FLAGS","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&__str_4);
      (*(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
                (pcVar6,pmVar20,&ppRspFile);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_4._M_dataplus._M_p != paVar2) {
        operator_delete(__str_4._M_dataplus._M_p,__str_4.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppRspFile._M_dataplus._M_p != paVar1) {
        operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
      }
      ppRspFile._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&ppRspFile,"DEFINES","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&targetNames,&ppRspFile);
      __str_4._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_4,"DEFINES","");
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&vars,&__str_4);
      std::__cxx11::string::swap((string *)pmVar20);
    }
    else {
      ppRspFile._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&ppRspFile,"DEFINES","");
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&vars,&ppRspFile);
      __str_4._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str_4,"DEFINES","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&targetNames,&__str_4);
      std::__cxx11::string::_M_assign((string *)pmVar20);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_4._M_dataplus._M_p != paVar2) {
      operator_delete(__str_4._M_dataplus._M_p,__str_4.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppRspFile._M_dataplus._M_p != paVar1) {
      operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
    }
    ppRspFile._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ppRspFile,"INCLUDES","");
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[](&vars,&ppRspFile);
    __str_4._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str_4,"INCLUDES","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&targetNames,&__str_4);
    std::__cxx11::string::_M_assign((string *)pmVar20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_4._M_dataplus._M_p != paVar2) {
      operator_delete(__str_4._M_dataplus._M_p,__str_4.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppRspFile._M_dataplus._M_p != paVar1) {
      operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
    }
    if (iVar18 == 0) {
      sourceDirectory.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      sourceDirectory.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      sourceDirectory.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      psVar19 = cmSourceFile::GetFullPath_abi_cxx11_(source);
      cmsys::SystemTools::GetParentDirectory(&ppRspFile,psVar19);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &sourceDirectory,&ppRspFile);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppRspFile._M_dataplus._M_p != paVar1) {
        operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
      }
      pcVar3 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      pcVar6 = this->LocalGenerator;
      psVar19 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_
                          (&this->super_cmCommonTargetGenerator);
      cmLocalGenerator::GetIncludeFlags
                (&ppRspFile,(cmLocalGenerator *)pcVar6,&sourceDirectory,pcVar3,&language,false,false
                 ,psVar19);
      __str_3._M_dataplus._M_p = (pointer)&__str_3.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__str_3,ppRspFile._M_dataplus._M_p,
                 ppRspFile._M_dataplus._M_p + ppRspFile._M_string_length);
      std::__cxx11::string::append((char *)&__str_3);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"INCLUDES","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&local_88);
      plVar22 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&__str_3,(ulong)(pmVar20->_M_dataplus)._M_p);
      psVar30 = (size_type *)(plVar22 + 2);
      if ((size_type *)*plVar22 == psVar30) {
        __str_4.field_2._M_allocated_capacity = *psVar30;
        __str_4.field_2._8_8_ = plVar22[3];
        __str_4._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        __str_4.field_2._M_allocated_capacity = *psVar30;
        __str_4._M_dataplus._M_p = (pointer)*plVar22;
      }
      __str_4._M_string_length = plVar22[1];
      *plVar22 = (long)psVar30;
      plVar22[1] = 0;
      *(undefined1 *)(plVar22 + 2) = 0;
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"INCLUDES","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&vars,&local_a8);
      std::__cxx11::string::operator=((string *)pmVar20,(string *)&__str_4);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_4._M_dataplus._M_p != paVar2) {
        operator_delete(__str_4._M_dataplus._M_p,__str_4.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_3._M_dataplus._M_p != &__str_3.field_2) {
        operator_delete(__str_3._M_dataplus._M_p,__str_3.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppRspFile._M_dataplus._M_p != paVar1) {
        operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&sourceDirectory);
    }
    pcVar6 = this->LocalGenerator;
    __str_4._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str_4,objectFileName._M_dataplus._M_p,
               objectFileName._M_dataplus._M_p + objectFileName._M_string_length);
    std::__cxx11::string::append((char *)&__str_4);
    cmOutputConverter::ConvertToOutputFormat
              (&ppRspFile,
               &(pcVar6->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&__str_4,SHELL);
    __str_3._M_dataplus._M_p = (pointer)&__str_3.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str_3,"DEP_FILE","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&targetNames,&__str_3);
    std::__cxx11::string::operator=((string *)pmVar20,(string *)&ppRspFile);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_3._M_dataplus._M_p != &__str_3.field_2) {
      operator_delete(__str_3._M_dataplus._M_p,__str_3.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppRspFile._M_dataplus._M_p != paVar1) {
      operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_4._M_dataplus._M_p != paVar2) {
      operator_delete(__str_4._M_dataplus._M_p,__str_4.field_2._M_allocated_capacity + 1);
    }
    if (iVar18 == 0) {
      ppRspFile._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&ppRspFile,"DEP_FILE","");
      pVar35 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::equal_range(&vars._M_t,&ppRspFile);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_erase_aux(&vars._M_t,(_Base_ptr)pVar35.first._M_node,(_Base_ptr)pVar35.second._M_node);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppRspFile._M_dataplus._M_p != paVar1) {
        operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
      }
    }
    if (iVar17 == 0) {
      ppRspFile._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&ppRspFile,"OBJ_FILE","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&targetNames,&ppRspFile);
      std::__cxx11::string::_M_assign((string *)pmVar20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppRspFile._M_dataplus._M_p != paVar1) {
        operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
      }
      ppRspFile._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&ppRspFile,objectFileName._M_dataplus._M_p,
                 objectFileName._M_dataplus._M_p + objectFileName._M_string_length);
      std::__cxx11::string::append((char *)&ppRspFile);
      __str_4._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&__str_4,"DYNDEP_INTERMEDIATE_FILE","");
      pmVar20 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&targetNames,&__str_4);
      std::__cxx11::string::_M_assign((string *)pmVar20);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str_4._M_dataplus._M_p != paVar2) {
        operator_delete(__str_4._M_dataplus._M_p,__str_4.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&ppImplicitOuts,&ppRspFile);
      this_02 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::operator[](&this->DDIFiles,&language);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_02,&ppRspFile);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ppRspFile._M_dataplus._M_p != paVar1) {
        operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
      }
    }
    ppRspFile._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ppRspFile,"JOB_POOL_COMPILE","");
    addPoolNinjaVariable
              (pcVar33,&ppRspFile,(this->super_cmCommonTargetGenerator).GeneratorTarget,
               (cmNinjaVars *)&targetNames);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppRspFile._M_dataplus._M_p != paVar1) {
      operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
    }
    ppRspFile._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&ppRspFile,ppFileName._M_dataplus._M_p,
               ppFileName._M_dataplus._M_p + ppFileName._M_string_length);
    std::__cxx11::string::append((char *)&ppRspFile);
    pcVar27 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    pcVar29 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    cmGlobalNinjaGenerator::WriteBuild
              (pcVar27,(ostream *)pcVar29->BuildFileStream,&rspfile,&ppRule,&ppOutputs,
               &ppImplicitOuts,&local_188,&local_1a8,&local_1c8,(cmNinjaVars *)&targetNames,
               &ppRspFile,-local_2e8,(bool *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppRspFile._M_dataplus._M_p != paVar1) {
      operator_delete(ppRspFile._M_dataplus._M_p,ppRspFile.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppFileName._M_dataplus._M_p != &ppFileName.field_2) {
      operator_delete(ppFileName._M_dataplus._M_p,ppFileName.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&targetNames);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_188);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ppImplicitOuts);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ppOutputs);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppRule._M_dataplus._M_p != &ppRule.field_2) {
      operator_delete(ppRule._M_dataplus._M_p,ppRule.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
      operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
    }
  }
  if (iVar17 == 0) {
    GetDyndepFilePath(&targetNames.Base,this,&language);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_228,&targetNames.Base);
    rspfile._M_dataplus._M_p = (pointer)&rspfile.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"dyndep","");
    pmVar20 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&vars,&rspfile);
    std::__cxx11::string::_M_assign((string *)pmVar20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
      operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
      operator_delete(targetNames.Base._M_dataplus._M_p,
                      targetNames.Base.field_2._M_allocated_capacity + 1);
    }
  }
  EnsureParentDirectoryExists(this,&objectFileName);
  cmOutputConverter::ConvertToOutputFormat
            (&targetNames.Base,
             &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
              super_cmOutputConverter,&objectDir,SHELL);
  paVar1 = &rspfile.field_2;
  rspfile._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"OBJECT_DIR","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&rspfile);
  std::__cxx11::string::operator=((string *)pmVar20,(string *)&targetNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != paVar1) {
    operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
    operator_delete(targetNames.Base._M_dataplus._M_p,
                    targetNames.Base.field_2._M_allocated_capacity + 1);
  }
  cmOutputConverter::ConvertToOutputFormat
            (&targetNames.Base,
             &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
              super_cmOutputConverter,&objectFileDir,SHELL);
  rspfile._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&rspfile,"OBJECT_FILE_DIR","");
  pmVar20 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&vars,&rspfile);
  std::__cxx11::string::operator=((string *)pmVar20,(string *)&targetNames);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != paVar1) {
    operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
    operator_delete(targetNames.Base._M_dataplus._M_p,
                    targetNames.Base.field_2._M_allocated_capacity + 1);
  }
  pcVar33 = (cmNinjaTargetGenerator *)&targetNames;
  targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)pcVar33,"JOB_POOL_COMPILE","");
  addPoolNinjaVariable
            (pcVar33,&targetNames.Base,(this->super_cmCommonTargetGenerator).GeneratorTarget,&vars);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
    operator_delete(targetNames.Base._M_dataplus._M_p,
                    targetNames.Base.field_2._M_allocated_capacity + 1);
  }
  SetMsvcTargetPdbVariable(this,&vars);
  rspfile._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&rspfile,objectFileName._M_dataplus._M_p,
             objectFileName._M_dataplus._M_p + objectFileName._M_string_length);
  std::__cxx11::string::append((char *)&rspfile);
  pcVar27 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  pcVar29 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  targetNames.Base.field_2._M_allocated_capacity = 0;
  targetNames.Base._M_dataplus._M_p = (pointer)0x0;
  targetNames.Base._M_string_length = 0;
  cmGlobalNinjaGenerator::WriteBuild
            (pcVar27,(ostream *)pcVar29->BuildFileStream,&comment,&rule,&outputs,
             (cmNinjaDeps *)&targetNames,&local_168,&local_1e8,&local_228,&vars,&rspfile,-local_2e8,
             (bool *)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&targetNames);
  targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&targetNames,"OBJECT_OUTPUTS","");
  pcVar23 = cmSourceFile::GetProperty(source,&targetNames.Base);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
    operator_delete(targetNames.Base._M_dataplus._M_p,
                    targetNames.Base.field_2._M_allocated_capacity + 1);
  }
  if (pcVar23 != (char *)0x0) {
    ppFileName._M_dataplus._M_p = (pointer)0x0;
    ppFileName._M_string_length = 0;
    ppFileName.field_2._M_allocated_capacity = 0;
    targetNames.Base._M_dataplus._M_p = (pointer)&targetNames.Base.field_2;
    sVar24 = strlen(pcVar23);
    std::__cxx11::string::_M_construct<char_const*>((string *)&targetNames,pcVar23,pcVar23 + sVar24)
    ;
    cmSystemTools::ExpandListArgument
              (&targetNames.Base,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&ppFileName,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetNames.Base._M_dataplus._M_p != &targetNames.Base.field_2) {
      operator_delete(targetNames.Base._M_dataplus._M_p,
                      targetNames.Base.field_2._M_allocated_capacity + 1);
    }
    sVar10 = ppFileName._M_string_length;
    _Var32._M_p = ppFileName._M_dataplus._M_p;
    MVar25.GG = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    std::
    transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )_Var32._M_p,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )sVar10,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         )_Var32._M_p,MVar25);
    pcVar27 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    pcVar29 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    os = pcVar29->BuildFileStream;
    ppRule._M_dataplus._M_p = (pointer)&ppRule.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ppRule,"Additional output files.","")
    ;
    ppRspFile._M_dataplus._M_p = (pointer)0x0;
    ppRspFile._M_string_length = 0;
    ppRspFile.field_2._M_allocated_capacity = 0;
    __str_4.field_2._M_allocated_capacity = 0;
    __str_4._M_dataplus._M_p = (pointer)0x0;
    __str_4._M_string_length = 0;
    targetNames.Base.field_2._8_8_ = &targetNames.Base._M_string_length;
    targetNames.Base.field_2._M_allocated_capacity = 0;
    targetNames.Base._M_dataplus._M_p = (pointer)0x0;
    targetNames.Base._M_string_length = 0;
    targetNames.Output._M_string_length = 0;
    targetNames.Output._M_dataplus._M_p = (pointer)targetNames.Base.field_2._8_8_;
    cmGlobalNinjaGenerator::WritePhonyBuild
              (pcVar27,(ostream *)os,&ppRule,(cmNinjaDeps *)&ppFileName,&outputs,
               (cmNinjaDeps *)&ppRspFile,(cmNinjaDeps *)&__str_4,(cmNinjaVars *)&targetNames);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&targetNames);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__str_4);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ppRspFile);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ppRule._M_dataplus._M_p != &ppRule.field_2) {
      operator_delete(ppRule._M_dataplus._M_p,ppRule.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ppFileName);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rspfile._M_dataplus._M_p != &rspfile.field_2) {
    operator_delete(rspfile._M_dataplus._M_p,rspfile.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&outputs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rule._M_dataplus._M_p != &rule.field_2) {
    operator_delete(rule._M_dataplus._M_p,rule.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)comment._M_dataplus._M_p != &comment.field_2) {
    operator_delete(comment._M_dataplus._M_p,
                    CONCAT71(comment.field_2._M_allocated_capacity._1_7_,
                             comment.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objectFileDir._M_dataplus._M_p != &objectFileDir.field_2) {
    operator_delete(objectFileDir._M_dataplus._M_p,objectFileDir.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objectFileName._M_dataplus._M_p != &objectFileName.field_2) {
    operator_delete(objectFileName._M_dataplus._M_p,objectFileName.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)objectDir._M_dataplus._M_p != &objectDir.field_2) {
    operator_delete(objectDir._M_dataplus._M_p,objectDir.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sourceFileName._M_dataplus._M_p != &sourceFileName.field_2) {
    operator_delete(sourceFileName._M_dataplus._M_p,sourceFileName.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)language._M_dataplus._M_p != &language.field_2) {
    operator_delete(language._M_dataplus._M_p,language.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteObjectBuildStatement(
  cmSourceFile const* source)
{
  std::string const language = source->GetLanguage();
  std::string const sourceFileName =
    language == "RC" ? source->GetFullPath() : this->GetSourceFilePath(source);
  std::string const objectDir =
    this->ConvertToNinjaPath(this->GeneratorTarget->GetSupportDirectory());
  std::string const objectFileName =
    this->ConvertToNinjaPath(this->GetObjectFilePath(source));
  std::string const objectFileDir =
    cmSystemTools::GetFilenamePath(objectFileName);

  bool const lang_supports_response =
    !(language == "RC" || language == "CUDA");
  int const commandLineLengthLimit =
    ((lang_supports_response && this->ForceResponseFile())) ? -1 : 0;

  cmNinjaVars vars;
  vars["FLAGS"] = this->ComputeFlagsForObject(source, language);
  vars["DEFINES"] = this->ComputeDefines(source, language);
  vars["INCLUDES"] = this->ComputeIncludes(source, language);
  if (language == "Swift") {
    // The swift compiler needs all the sources besides the one being compiled
    // in order to do the type checking.  List all these "auxiliary" sources.
    std::string aux_sources;
    cmGeneratorTarget::KindedSources const& sources =
      this->GeneratorTarget->GetKindedSources(this->GetConfigName());
    for (cmGeneratorTarget::SourceAndKind const& src : sources.Sources) {
      if (src.Source.Value == source) {
        continue;
      }
      aux_sources += " " + this->GetSourceFilePath(src.Source.Value);
    }
    vars["SWIFT_AUXILIARY_SOURCES"] = aux_sources;

    if (const char* name =
          this->GeneratorTarget->GetProperty("SWIFT_MODULE_NAME")) {
      vars["SWIFT_MODULE_NAME"] = name;
    } else {
      vars["SWIFT_MODULE_NAME"] = this->GeneratorTarget->GetName();
    }

    cmGeneratorTarget::Names targetNames =
      this->GeneratorTarget->GetLibraryNames(this->GetConfigName());
    vars["SWIFT_LIBRARY_NAME"] = targetNames.Base;

    if (const char* partial = source->GetProperty("SWIFT_PARTIAL_MODULE")) {
      vars["SWIFT_PARTIAL_MODULE"] = partial;
    } else {
      vars["SWIFT_PARTIAL_MODULE"] = objectFileName + ".swiftmodule";
    }

    if (const char* partial = source->GetProperty("SWIFT_PARTIAL_DOC")) {
      vars["SWIFT_PARTIAL_DOC"] = partial;
    } else {
      vars["SWIFT_PARTIAL_DOC"] = objectFileName + ".swiftdoc";
    }
  }

  if (!this->NeedDepTypeMSVC(language)) {
    bool replaceExt(false);
    if (!language.empty()) {
      std::string repVar = "CMAKE_";
      repVar += language;
      repVar += "_DEPFILE_EXTENSION_REPLACE";
      replaceExt = this->Makefile->IsOn(repVar);
    }
    if (!replaceExt) {
      // use original code
      vars["DEP_FILE"] = this->GetLocalGenerator()->ConvertToOutputFormat(
        objectFileName + ".d", cmOutputConverter::SHELL);
    } else {
      // Replace the original source file extension with the
      // depend file extension.
      std::string dependFileName =
        cmSystemTools::GetFilenameWithoutLastExtension(objectFileName) + ".d";
      vars["DEP_FILE"] = this->GetLocalGenerator()->ConvertToOutputFormat(
        objectFileDir + "/" + dependFileName, cmOutputConverter::SHELL);
    }
  }

  this->ExportObjectCompileCommand(
    language, sourceFileName, objectDir, objectFileName, objectFileDir,
    vars["FLAGS"], vars["DEFINES"], vars["INCLUDES"]);

  std::string comment;
  std::string rule = this->LanguageCompilerRule(language);

  cmNinjaDeps outputs;
  outputs.push_back(objectFileName);
  // Add this object to the list of object files.
  this->Objects.push_back(objectFileName);

  cmNinjaDeps explicitDeps;
  explicitDeps.push_back(sourceFileName);

  cmNinjaDeps implicitDeps;
  if (const char* objectDeps = source->GetProperty("OBJECT_DEPENDS")) {
    std::vector<std::string> depList;
    cmSystemTools::ExpandListArgument(objectDeps, depList);
    for (std::string& odi : depList) {
      if (cmSystemTools::FileIsFullPath(odi)) {
        odi = cmSystemTools::CollapseFullPath(odi);
      }
    }
    std::transform(depList.begin(), depList.end(),
                   std::back_inserter(implicitDeps), MapToNinjaPath());
  }

  cmNinjaDeps orderOnlyDeps;
  orderOnlyDeps.push_back(this->OrderDependsTargetForTarget());

  // If the source file is GENERATED and does not have a custom command
  // (either attached to this source file or another one), assume that one of
  // the target dependencies, OBJECT_DEPENDS or header file custom commands
  // will rebuild the file.
  if (source->GetIsGenerated() &&
      !source->GetPropertyAsBool("__CMAKE_GENERATED_BY_CMAKE") &&
      !source->GetCustomCommand() &&
      !this->GetGlobalGenerator()->HasCustomCommandOutput(sourceFileName)) {
    this->GetGlobalGenerator()->AddAssumedSourceDependencies(sourceFileName,
                                                             orderOnlyDeps);
  }

  // For some cases we need to generate a ninja dyndep file.
  bool const needDyndep = this->NeedDyndep(language);

  // For some cases we do an explicit preprocessor invocation.
  bool const explicitPP = this->NeedExplicitPreprocessing(language);
  if (explicitPP) {
    bool const compilePP = this->UsePreprocessedSource(language);
    std::string const ppComment;
    std::string const ppRule = this->LanguagePreprocessRule(language);
    cmNinjaDeps ppOutputs;
    cmNinjaDeps ppImplicitOuts;
    cmNinjaDeps ppExplicitDeps;
    cmNinjaDeps ppImplicitDeps;
    cmNinjaDeps ppOrderOnlyDeps;
    cmNinjaVars ppVars;

    std::string const ppFileName =
      this->ConvertToNinjaPath(this->GetPreprocessedFilePath(source));
    ppOutputs.push_back(ppFileName);

    if (compilePP) {
      // Move compilation dependencies to the preprocessing build statement.
      std::swap(ppExplicitDeps, explicitDeps);
      std::swap(ppImplicitDeps, implicitDeps);
      std::swap(ppOrderOnlyDeps, orderOnlyDeps);
      std::swap(ppVars["IN_ABS"], vars["IN_ABS"]);

      // The actual compilation will now use the preprocessed source.
      explicitDeps.push_back(ppFileName);
    } else {
      // Copy compilation dependencies to the preprocessing build statement.
      ppExplicitDeps = explicitDeps;
      ppImplicitDeps = implicitDeps;
      ppOrderOnlyDeps = orderOnlyDeps;
      ppVars["IN_ABS"] = vars["IN_ABS"];
    }

    // Preprocessing and compilation generally use the same flags.
    ppVars["FLAGS"] = vars["FLAGS"];

    if (compilePP) {
      // In case compilation requires flags that are incompatible with
      // preprocessing, include them here.
      std::string const postFlag = this->Makefile->GetSafeDefinition(
        "CMAKE_" + language + "_POSTPROCESS_FLAG");
      this->LocalGenerator->AppendFlags(vars["FLAGS"], postFlag);
    }

    if (compilePP) {
      // Move preprocessor definitions to the preprocessor build statement.
      std::swap(ppVars["DEFINES"], vars["DEFINES"]);
    } else {
      // Copy preprocessor definitions to the preprocessor build statement.
      ppVars["DEFINES"] = vars["DEFINES"];
    }

    // Copy include directories to the preprocessor build statement.  The
    // Fortran compilation build statement still needs them for the INCLUDE
    // directive.
    ppVars["INCLUDES"] = vars["INCLUDES"];

    if (compilePP) {
      // Prepend source file's original directory as an include directory
      // so e.g. Fortran INCLUDE statements can look for files in it.
      std::vector<std::string> sourceDirectory;
      sourceDirectory.push_back(
        cmSystemTools::GetParentDirectory(source->GetFullPath()));

      std::string sourceDirectoryFlag = this->LocalGenerator->GetIncludeFlags(
        sourceDirectory, this->GeneratorTarget, language, false, false,
        this->GetConfigName());

      vars["INCLUDES"] = sourceDirectoryFlag + " " + vars["INCLUDES"];
    }

    // Explicit preprocessing always uses a depfile.
    ppVars["DEP_FILE"] = this->GetLocalGenerator()->ConvertToOutputFormat(
      objectFileName + ".pp.d", cmOutputConverter::SHELL);
    if (compilePP) {
      // The actual compilation does not need a depfile because it
      // depends on the already-preprocessed source.
      vars.erase("DEP_FILE");
    }

    if (needDyndep) {
      // Tell dependency scanner the object file that will result from
      // compiling the source.
      ppVars["OBJ_FILE"] = objectFileName;

      // Tell dependency scanner where to store dyndep intermediate results.
      std::string const ddiFile = objectFileName + ".ddi";
      ppVars["DYNDEP_INTERMEDIATE_FILE"] = ddiFile;
      ppImplicitOuts.push_back(ddiFile);
      this->DDIFiles[language].push_back(ddiFile);
    }

    this->addPoolNinjaVariable("JOB_POOL_COMPILE", this->GetGeneratorTarget(),
                               ppVars);

    std::string const ppRspFile = ppFileName + ".rsp";

    this->GetGlobalGenerator()->WriteBuild(
      this->GetBuildFileStream(), ppComment, ppRule, ppOutputs, ppImplicitOuts,
      ppExplicitDeps, ppImplicitDeps, ppOrderOnlyDeps, ppVars, ppRspFile,
      commandLineLengthLimit);
  }
  if (needDyndep) {
    std::string const dyndep = this->GetDyndepFilePath(language);
    orderOnlyDeps.push_back(dyndep);
    vars["dyndep"] = dyndep;
  }

  EnsureParentDirectoryExists(objectFileName);

  vars["OBJECT_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    objectDir, cmOutputConverter::SHELL);
  vars["OBJECT_FILE_DIR"] = this->GetLocalGenerator()->ConvertToOutputFormat(
    objectFileDir, cmOutputConverter::SHELL);

  this->addPoolNinjaVariable("JOB_POOL_COMPILE", this->GetGeneratorTarget(),
                             vars);

  this->SetMsvcTargetPdbVariable(vars);

  std::string const rspfile = objectFileName + ".rsp";

  this->GetGlobalGenerator()->WriteBuild(
    this->GetBuildFileStream(), comment, rule, outputs,
    /*implicitOuts=*/cmNinjaDeps(), explicitDeps, implicitDeps, orderOnlyDeps,
    vars, rspfile, commandLineLengthLimit);

  if (const char* objectOutputs = source->GetProperty("OBJECT_OUTPUTS")) {
    std::vector<std::string> outputList;
    cmSystemTools::ExpandListArgument(objectOutputs, outputList);
    std::transform(outputList.begin(), outputList.end(), outputList.begin(),
                   MapToNinjaPath());
    this->GetGlobalGenerator()->WritePhonyBuild(this->GetBuildFileStream(),
                                                "Additional output files.",
                                                outputList, outputs);
  }
}